

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgstrs.c
# Opt level: O2

void cgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  singlecomplex *psVar4;
  void *pvVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  singlecomplex *Mxvec;
  singlecomplex *addr;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  singlecomplex *psVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong n;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  float *pfVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  singlecomplex *psVar25;
  bool bVar26;
  float fVar27;
  float fVar30;
  singlecomplex sVar28;
  singlecomplex sVar29;
  float fVar31;
  float fVar33;
  singlecomplex sVar32;
  float fVar34;
  long local_158;
  int ii;
  
  *info = 0;
  if (trans < (CONJ|TRANS)) {
    uVar1 = L->nrow;
    n = (ulong)uVar1;
    ii = 2;
    iVar19 = -2;
    if ((((-1 < (int)uVar1) && (uVar1 == L->ncol)) && (L->Stype == SLU_SC)) &&
       ((L->Dtype == SLU_C && (L->Mtype == SLU_TRLU)))) {
      ii = 3;
      iVar19 = -3;
      if (((-1 < U->nrow) && ((U->nrow == U->ncol && (U->Stype == SLU_NC)))) &&
         ((U->Dtype == SLU_C && (U->Mtype == SLU_TRU)))) {
        puVar3 = (uint *)B->Store;
        uVar22 = *puVar3;
        uVar13 = (ulong)uVar22;
        ii = 6;
        iVar19 = -6;
        if (((((int)uVar1 <= (int)uVar22) && (B->Stype == SLU_DN)) && (B->Dtype == SLU_C)) &&
           (B->Mtype == SLU_GE)) {
          uVar1 = B->ncol;
          Mxvec = singlecomplexCalloc(n * (long)(int)uVar1);
          if (Mxvec == (singlecomplex *)0x0) {
            sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8d,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgstrs.c"
                   );
            superlu_abort_and_exit((char *)&ii);
          }
          addr = singlecomplexMalloc(n);
          if (addr != (singlecomplex *)0x0) {
            psVar4 = *(singlecomplex **)(puVar3 + 2);
            uVar16 = 0;
            if (0 < (int)uVar1) {
              uVar16 = (ulong)uVar1;
            }
            if (trans == NOTRANS) {
              pvVar5 = L->Store;
              lVar6 = *(long *)((long)pvVar5 + 8);
              pvVar7 = U->Store;
              lVar8 = *(long *)((long)pvVar7 + 8);
              psVar12 = psVar4;
              for (uVar9 = 0; uVar9 != uVar16; uVar9 = uVar9 + 1) {
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  addr[perm_r[uVar14]] = psVar12[uVar14];
                }
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  psVar12[uVar14] = addr[uVar14];
                }
                psVar12 = psVar12 + uVar13;
              }
              fVar34 = 0.0;
              local_158 = 0;
              while (uVar9 = (ulong)*(int *)((long)pvVar5 + 4), local_158 <= (long)uVar9) {
                lVar24 = (long)*(int *)(*(long *)((long)pvVar5 + 0x30) + local_158 * 4);
                iVar19 = *(int *)(*(long *)((long)pvVar5 + 0x20) + lVar24 * 4);
                iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x20) + 4 + lVar24 * 4);
                iVar21 = iVar2 - iVar19;
                lVar17 = *(int *)(*(long *)((long)pvVar5 + 0x30) + 4 + local_158 * 4) - lVar24;
                iVar15 = (int)lVar17;
                uVar22 = iVar21 - iVar15;
                local_158 = local_158 + 1;
                fVar34 = (float)(int)(uVar1 * 8 * iVar15 * uVar22) +
                         fVar34 + (float)(int)(uVar1 * 4 * iVar15 * (iVar15 + -1));
                if (iVar15 == 1) {
                  for (uVar9 = 0; uVar9 != uVar16; uVar9 = uVar9 + 1) {
                    lVar18 = uVar9 * uVar13;
                    pfVar20 = (float *)((long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar24 * 4)
                                        * 8 + lVar6 + 0xc);
                    lVar17 = (long)iVar19;
                    while (lVar17 = lVar17 + 1, lVar17 < iVar2) {
                      lVar23 = (long)*(int *)(*(long *)((long)pvVar5 + 0x18) + lVar17 * 4);
                      fVar27 = psVar4[lVar18 + lVar24].r;
                      fVar30 = psVar4[lVar18 + lVar24].i;
                      sVar28.r = psVar4[lVar18 + lVar23].r -
                                 (pfVar20[-1] * fVar27 + -fVar30 * *pfVar20);
                      sVar28.i = psVar4[lVar18 + lVar23].i -
                                 (pfVar20[-1] * fVar30 + fVar27 * *pfVar20);
                      psVar4[lVar18 + lVar23] = sVar28;
                      pfVar20 = pfVar20 + 2;
                    }
                  }
                }
                else {
                  lVar18 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar24 * 4);
                  uVar9 = 0;
                  if (0 < (int)uVar22) {
                    uVar9 = (ulong)uVar22;
                  }
                  for (uVar14 = 0; uVar14 != uVar16; uVar14 = uVar14 + 1) {
                    lVar23 = uVar14 * uVar13;
                    clsolve(iVar21,iVar15,(singlecomplex *)(lVar6 + lVar18 * 8),
                            psVar4 + lVar23 + lVar24);
                    cmatvec(iVar21,uVar22,iVar15,(singlecomplex *)(lVar6 + (lVar17 + lVar18) * 8),
                            psVar4 + lVar23 + lVar24,Mxvec);
                    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
                      lVar11 = (long)*(int *)(*(long *)((long)pvVar5 + 0x18) +
                                              (long)(iVar19 + iVar15) * 4 + uVar10 * 4);
                      sVar29.r = psVar4[lVar23 + lVar11].r - Mxvec[uVar10].r;
                      sVar29.i = psVar4[lVar23 + lVar11].i - Mxvec[uVar10].i;
                      psVar4[lVar23 + lVar11] = sVar29;
                      Mxvec[uVar10].r = 0.0;
                      Mxvec[uVar10].i = 0.0;
                    }
                  }
                }
              }
              for (; -1 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
                iVar19 = *(int *)(*(long *)((long)pvVar5 + 0x30) + (uVar9 & 0xffffffff) * 4);
                lVar17 = (long)iVar19;
                iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x30) + 4 + (uVar9 & 0xffffffff) * 4);
                iVar19 = iVar2 - iVar19;
                psVar12 = (singlecomplex *)
                          (lVar6 + (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar17 * 4) * 8);
                if (iVar19 == 1) {
                  psVar25 = psVar4 + lVar17;
                  uVar14 = uVar16;
                  while (iVar15 = (int)uVar14, uVar14 = (ulong)(iVar15 - 1), iVar15 != 0) {
                    c_div(psVar25,psVar25,psVar12);
                    psVar25 = psVar25 + uVar13;
                  }
                }
                else {
                  iVar15 = *(int *)(*(long *)((long)pvVar5 + 0x20) + 4 + lVar17 * 4);
                  iVar21 = *(int *)(*(long *)((long)pvVar5 + 0x20) + lVar17 * 4);
                  psVar25 = psVar4 + lVar17;
                  uVar14 = uVar16;
                  while (bVar26 = uVar14 != 0, uVar14 = uVar14 - 1, bVar26) {
                    cusolve(iVar15 - iVar21,iVar19,psVar12,psVar25);
                    psVar25 = psVar25 + uVar13;
                  }
                }
                fVar34 = fVar34 + (float)(int)((iVar19 + 1) * uVar1 * 4 * iVar19);
                for (uVar14 = 0; uVar14 != uVar16; uVar14 = uVar14 + 1) {
                  lVar18 = uVar14 * uVar13;
                  lVar24 = lVar17;
                  while (lVar24 < iVar2) {
                    iVar19 = *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar24 * 4);
                    iVar15 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar24 * 4);
                    for (lVar23 = (long)iVar15; lVar23 < iVar19; lVar23 = lVar23 + 1) {
                      lVar11 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar23 * 4);
                      fVar31 = psVar4[lVar18 + lVar24].r;
                      fVar33 = psVar4[lVar18 + lVar24].i;
                      fVar27 = *(float *)(lVar8 + lVar23 * 8);
                      fVar30 = *(float *)(lVar8 + 4 + lVar23 * 8);
                      sVar32.r = psVar4[lVar18 + lVar11].r - (fVar27 * fVar31 + -fVar33 * fVar30);
                      sVar32.i = psVar4[lVar18 + lVar11].i - (fVar27 * fVar33 + fVar31 * fVar30);
                      psVar4[lVar18 + lVar11] = sVar32;
                    }
                    fVar34 = fVar34 + (float)((iVar19 - iVar15) * 8);
                    lVar24 = lVar24 + 1;
                  }
                }
              }
              psVar12 = psVar4;
              for (uVar9 = 0; uVar9 != uVar16; uVar9 = uVar9 + 1) {
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  addr[uVar14] = psVar4[uVar9 * uVar13 + (long)perm_c[uVar14]];
                }
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  psVar12[uVar14] = addr[uVar14];
                }
                psVar12 = psVar12 + uVar13;
              }
              stat->ops[0x11] = fVar34;
            }
            else {
              psVar12 = psVar4;
              for (uVar9 = 0; uVar9 != uVar16; uVar9 = uVar9 + 1) {
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  addr[perm_c[uVar14]] = psVar12[uVar14];
                }
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  psVar12[uVar14] = addr[uVar14];
                }
                psVar12 = psVar12 + uVar13;
              }
              stat->ops[0x11] = 0.0;
              psVar12 = psVar4;
              uVar9 = uVar16;
              if (trans == TRANS) {
                while (uVar9 != 0) {
                  sp_ctrsv("U","T","N",L,U,psVar12,stat,info);
                  sp_ctrsv("L","T","U",L,U,psVar12,stat,info);
                  uVar9 = uVar9 - 1;
                  psVar12 = psVar12 + uVar13;
                }
              }
              else {
                while (uVar9 != 0) {
                  sp_ctrsv("U","C","N",L,U,psVar12,stat,info);
                  sp_ctrsv("L","C","U",L,U,psVar12,stat,info);
                  psVar12 = psVar12 + uVar13;
                  uVar9 = uVar9 - 1;
                }
              }
              psVar12 = psVar4;
              for (uVar9 = 0; uVar9 != uVar16; uVar9 = uVar9 + 1) {
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  addr[uVar14] = psVar4[uVar9 * uVar13 + (long)perm_r[uVar14]];
                }
                for (uVar14 = 0; n != uVar14; uVar14 = uVar14 + 1) {
                  psVar12[uVar14] = addr[uVar14];
                }
                psVar12 = psVar12 + uVar13;
              }
            }
            superlu_free(Mxvec);
            superlu_free(addr);
            return;
          }
          sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8f,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgstrs.c"
                 );
          superlu_abort_and_exit((char *)&ii);
        }
      }
    }
  }
  else {
    ii = 1;
    iVar19 = -1;
  }
  *info = iVar19;
  input_error("cgstrs",&ii);
  return;
}

Assistant:

void
cgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    singlecomplex   alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    singlecomplex   *work_col;
#endif
    singlecomplex   temp_comp;
    DNformat *Bstore;
    singlecomplex   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    singlecomplex   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void cprint_soln(int n, int nrhs, const singlecomplex *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_C || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("cgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = singlecomplexCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = singlecomplexMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += 4 * nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 8 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			cc_mult(&temp_comp, &rhs_work[fsupc], &Lval[luptr]);
			c_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		CTRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		CGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		ctrsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		cgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			c_sub(&rhs_work[irow], &rhs_work[irow], &work_col[i]);
			work_col[i].r = 0.0;
	                work_col[i].i = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    clsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    cmatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			c_sub(&rhs_work[irow], &rhs_work[irow], &work[i]);
			work[i].r = 0.;
	                work[i].i = 0.;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	cprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += 4 * nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    c_div(&rhs_work[fsupc], &rhs_work[fsupc], &Lval[luptr]);
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		CTRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		ctrsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    cusolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			cc_mult(&temp_comp, &rhs_work[jcol], &Uval[i]);
			c_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	cprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
        if (trans == TRANS) {
	    for (k = 0; k < nrhs; ++k) {
	        /* Multiply by inv(U'). */
	        sp_ctrsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	        /* Multiply by inv(L'). */
	        sp_ctrsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         } else { /* trans == CONJ */
            for (k = 0; k < nrhs; ++k) {                
                /* Multiply by conj(inv(U')). */
                sp_ctrsv("U", "C", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
                
                /* Multiply by conj(inv(L')). */
                sp_ctrsv("L", "C", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         }
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}